

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lib.c
# Opt level: O0

int EVP_PKEY_can_sign(EVP_PKEY *pkey)

{
  int iVar1;
  OSSL_PROVIDER *prov_00;
  EVP_SIGNATURE *signature_00;
  EVP_SIGNATURE *pEVar2;
  long in_RDI;
  EVP_SIGNATURE *signature;
  char *supported_sig;
  OSSL_LIB_CTX *libctx;
  OSSL_PROVIDER *prov;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  if (*(long *)(in_RDI + 0x60) == 0) {
    iVar1 = EVP_PKEY_get_base_id((EVP_PKEY *)0x275ec3);
    if (iVar1 == 6) {
      return 1;
    }
    if (iVar1 == 0x74) {
      return 1;
    }
    if (iVar1 == 0x198) {
      iVar1 = EC_KEY_can_sign(*(EC_KEY **)(in_RDI + 0x20));
      return iVar1;
    }
    if (iVar1 - 0x43fU < 2) {
      return 1;
    }
  }
  else {
    prov_00 = EVP_KEYMGMT_get0_provider(*(EVP_KEYMGMT **)(in_RDI + 0x60));
    ossl_provider_libctx(prov_00);
    if (*(long *)(*(long *)(in_RDI + 0x60) + 0x98) == 0) {
      signature_00 = (EVP_SIGNATURE *)EVP_KEYMGMT_get0_name(*(EVP_KEYMGMT **)(in_RDI + 0x60));
    }
    else {
      signature_00 = (EVP_SIGNATURE *)(**(code **)(*(long *)(in_RDI + 0x60) + 0x98))(0xc);
    }
    pEVar2 = EVP_SIGNATURE_fetch((OSSL_LIB_CTX *)0x0,
                                 (char *)CONCAT44(in_stack_ffffffffffffffcc,
                                                  in_stack_ffffffffffffffc8),(char *)signature_00);
    if (pEVar2 != (EVP_SIGNATURE *)0x0) {
      EVP_SIGNATURE_free(signature_00);
      return 1;
    }
  }
  return 0;
}

Assistant:

int EVP_PKEY_can_sign(const EVP_PKEY *pkey)
{
    if (pkey->keymgmt == NULL) {
        switch (EVP_PKEY_get_base_id(pkey)) {
        case EVP_PKEY_RSA:
            return 1;
# ifndef OPENSSL_NO_DSA
        case EVP_PKEY_DSA:
            return 1;
# endif
# ifndef OPENSSL_NO_EC
        case EVP_PKEY_ED25519:
        case EVP_PKEY_ED448:
            return 1;
        case EVP_PKEY_EC:        /* Including SM2 */
            return EC_KEY_can_sign(pkey->pkey.ec);
# endif
        default:
            break;
        }
    } else {
        const OSSL_PROVIDER *prov = EVP_KEYMGMT_get0_provider(pkey->keymgmt);
        OSSL_LIB_CTX *libctx = ossl_provider_libctx(prov);
        const char *supported_sig =
            pkey->keymgmt->query_operation_name != NULL
            ? pkey->keymgmt->query_operation_name(OSSL_OP_SIGNATURE)
            : EVP_KEYMGMT_get0_name(pkey->keymgmt);
        EVP_SIGNATURE *signature = NULL;

        signature = EVP_SIGNATURE_fetch(libctx, supported_sig, NULL);
        if (signature != NULL) {
            EVP_SIGNATURE_free(signature);
            return 1;
        }
    }
    return 0;
}